

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O2

DdNode * extraZddUnateInfoCompute(DdManager *dd,DdNode *bFunc,DdNode *bVars)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *P;
  int iVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  
  pDVar8 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
  if (pDVar8->index == 0x7fffffff) {
    if (bVars->index != 0x7fffffff) {
      pDVar8 = extraZddGetSingletonsBoth(dd,bVars);
      return pDVar8;
    }
    return dd->zero;
  }
  if (dd->one == bVars) {
    __assert_fail("bVars != b1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddUnate.c"
                  ,399,"DdNode *extraZddUnateInfoCompute(DdManager *, DdNode *, DdNode *)");
  }
  pDVar4 = cuddCacheLookup2Zdd(dd,extraZddUnateInfoCompute,bFunc,bVars);
  if (pDVar4 != (DdNode *)0x0) {
    return pDVar4;
  }
  iVar2 = dd->perm[pDVar8->index];
  pDVar4 = bVars;
  while (dd->perm[pDVar4->index] < iVar2) {
    pDVar4 = (pDVar4->type).kids.T;
  }
  if (pDVar8->index != pDVar4->index) {
    __assert_fail("bFR->index == bVarsNew->index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddUnate.c"
                  ,0x1a5,"DdNode *extraZddUnateInfoCompute(DdManager *, DdNode *, DdNode *)");
  }
  pDVar9 = (pDVar8->type).kids.E;
  if (pDVar8 == bFunc) {
    pDVar5 = (pDVar8->type).kids.T;
  }
  else {
    pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
    pDVar5 = (DdNode *)((ulong)(pDVar8->type).kids.T ^ 1);
  }
  pDVar6 = extraZddUnateInfoCompute(dd,pDVar9,(pDVar4->type).kids.T);
  if (pDVar6 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  P = pDVar6;
  if (pDVar6 != dd->zero) {
    pDVar4 = extraZddUnateInfoCompute(dd,pDVar5,(pDVar4->type).kids.T);
    if (pDVar4 == (DdNode *)0x0) goto LAB_006821cf;
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    P = cuddZddIntersect(dd,pDVar6,pDVar4);
    if (P == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,pDVar6);
      pDVar6 = pDVar4;
      goto LAB_006821cf;
    }
    piVar1 = (int *)(((ulong)P & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDerefZdd(dd,pDVar6);
    Cudd_RecursiveDerefZdd(dd,pDVar4);
  }
  iVar3 = Cudd_bddLeq(dd,pDVar9,pDVar5);
  iVar7 = 0;
  pDVar6 = P;
  pDVar4 = bVars;
  if (iVar3 == 0) {
    iVar3 = Cudd_bddLeq(dd,pDVar5,pDVar9);
    if (iVar3 != 0) {
      iVar7 = 1;
      goto LAB_0068201f;
    }
  }
  else {
LAB_0068201f:
    pDVar8 = cuddZddGetNode(dd,iVar7 + pDVar8->index * 2,dd->one,dd->zero);
    if (pDVar8 == (DdNode *)0x0) goto LAB_006821cf;
    piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar6 = cuddZddUnion(dd,P,pDVar8);
    if (pDVar6 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,P);
      pDVar6 = pDVar8;
      goto LAB_006821cf;
    }
    piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDerefZdd(dd,P);
    Cudd_RecursiveDerefZdd(dd,pDVar8);
  }
  while( true ) {
    if (iVar2 <= dd->perm[pDVar4->index]) {
      piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      cuddCacheInsert2(dd,extraZddUnateInfoCompute,bFunc,bVars,pDVar6);
      return pDVar6;
    }
    pDVar8 = cuddZddGetNode(dd,pDVar4->index * 2 + 1,dd->one,dd->zero);
    if (pDVar8 == (DdNode *)0x0) goto LAB_006821cf;
    piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar9 = cuddZddUnion(dd,pDVar6,pDVar8);
    if (pDVar9 == (DdNode *)0x0) break;
    piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDerefZdd(dd,pDVar6);
    Cudd_RecursiveDerefZdd(dd,pDVar8);
    pDVar8 = cuddZddGetNode(dd,pDVar4->index * 2,dd->one,dd->zero);
    pDVar6 = pDVar9;
    if (pDVar8 == (DdNode *)0x0) goto LAB_006821cf;
    piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar5 = cuddZddUnion(dd,pDVar9,pDVar8);
    if (pDVar5 == (DdNode *)0x0) break;
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDerefZdd(dd,pDVar9);
    Cudd_RecursiveDerefZdd(dd,pDVar8);
    pDVar6 = pDVar5;
    pDVar4 = (pDVar4->type).kids.T;
  }
  Cudd_RecursiveDerefZdd(dd,pDVar6);
  pDVar6 = pDVar8;
LAB_006821cf:
  Cudd_RecursiveDerefZdd(dd,pDVar6);
  return (DdNode *)0x0;
}

Assistant:

DdNode * 
extraZddUnateInfoCompute( 
  DdManager * dd,   /* the manager */
  DdNode * bFunc,   /* the function whose symmetries are computed */
  DdNode * bVars )  /* the set of variables on which this function depends */
{
    DdNode * zRes;
    DdNode * bFR = Cudd_Regular(bFunc); 

    if ( cuddIsConstant(bFR) )
    {
        if ( cuddIsConstant(bVars) )
            return z0;
        return extraZddGetSingletonsBoth( dd, bVars );
    }
    assert( bVars != b1 );

    if ( (zRes = cuddCacheLookup2Zdd(dd, extraZddUnateInfoCompute, bFunc, bVars)) )
        return zRes;
    else
    {
        DdNode * zRes0, * zRes1;
        DdNode * zTemp, * zPlus;             
        DdNode * bF0, * bF1;             
        DdNode * bVarsNew;
        int nVarsExtra;
        int LevelF;
        int AddVar;

        // every variable in bF should be also in bVars, therefore LevelF cannot be above LevelV
        // if LevelF is below LevelV, scroll through the vars in bVars to the same level as F
        // count how many extra vars are there in bVars
        nVarsExtra = 0;
        LevelF = dd->perm[bFR->index];
        for ( bVarsNew = bVars; LevelF > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) )
            nVarsExtra++; 
        // the indexes (level) of variables should be synchronized now
        assert( bFR->index == bVarsNew->index );

        // cofactor the function
        if ( bFR != bFunc ) // bFunc is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        // solve subproblems
        zRes0 = extraZddUnateInfoCompute( dd, bF0, cuddT(bVarsNew) );
        if ( zRes0 == NULL )
            return NULL;
        cuddRef( zRes0 );

        // if there is no symmetries in the negative cofactor
        // there is no need to test the positive cofactor
        if ( zRes0 == z0 )
            zRes = zRes0;  // zRes takes reference
        else
        {
            zRes1 = extraZddUnateInfoCompute( dd, bF1, cuddT(bVarsNew) );
            if ( zRes1 == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                return NULL;
            }
            cuddRef( zRes1 );

            // only those variables are pair-wise symmetric 
            // that are pair-wise symmetric in both cofactors
            // therefore, intersect the solutions
            zRes = cuddZddIntersect( dd, zRes0, zRes1 );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                Cudd_RecursiveDerefZdd( dd, zRes1 );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            Cudd_RecursiveDerefZdd( dd, zRes1 );
        }

        // consider the current top-most variable
        AddVar = -1;
        if ( Cudd_bddLeq( dd, bF0, bF1 ) ) // pos
            AddVar = 0;
        else if ( Cudd_bddLeq( dd, bF1, bF0 ) ) // neg
            AddVar = 1;
        if ( AddVar >= 0 )
        {
            // create the singleton
            zPlus = cuddZddGetNode( dd, 2*bFR->index + AddVar, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }
        // only zRes is referenced at this point

        // if we skipped some variables, these variables cannot be symmetric with
        // any variables that are currently in the support of bF, but they can be 
        // symmetric with the variables that are in bVars but not in the support of bF
        for ( bVarsNew = bVars; LevelF > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) )
        {
            // create the negative singleton
            zPlus = cuddZddGetNode( dd, 2*bVarsNew->index+1, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        

            // create the positive singleton
            zPlus = cuddZddGetNode( dd, 2*bVarsNew->index, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }
        cuddDeref( zRes );

        /* insert the result into cache */
        cuddCacheInsert2(dd, extraZddUnateInfoCompute, bFunc, bVars, zRes);
        return zRes;
    }
}